

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gates.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Internal::find_if_then_else(Internal *this,Eliminator *eliminator,int pivot)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  reference ppCVar4;
  Clause *pCVar5;
  Clause *pCVar6;
  int iVar7;
  uint uVar8;
  int in_EDX;
  Internal *in_RDI;
  Clause *d2;
  Clause *d1;
  int cj;
  int bj;
  int aj;
  Clause *dj;
  __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  j;
  int ci;
  int bi;
  int ai;
  Clause *di;
  const_iterator i;
  const_iterator end;
  Occs *os;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Internal *in_stack_ffffffffffffffa8;
  __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_40;
  int local_3c;
  Clause *local_38;
  __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_30;
  Clause **local_28;
  Occs *local_20;
  int local_14;
  
  if (((((in_RDI->opts).elimites != 0) && ((in_RDI->unsat & 1U) == 0)) &&
      (local_14 = in_EDX, cVar2 = val(in_RDI,in_EDX), cVar2 == '\0')) &&
     (bVar3 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::empty
                        ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                         in_stack_ffffffffffffff80._M_current), bVar3)) {
    local_20 = occs(in_RDI,in_stack_ffffffffffffff6c);
    local_28 = (Clause **)
               std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
                         ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_30._M_current =
         (Clause **)
         std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                   ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                               *)in_RDI,
                              (__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
          bVar3) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                ::operator*(&local_30);
      local_38 = *ppCVar4;
      bVar3 = get_ternary_clause((Internal *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 (Clause *)in_stack_ffffffffffffffb0._M_current,
                                 &in_stack_ffffffffffffffa8->mode,
                                 (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),
                                 (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
      if (bVar3) {
        if (local_40 == local_14) {
          std::swap<int>(&local_3c,&local_40);
        }
        if (in_stack_ffffffffffffffbc == local_14) {
          std::swap<int>(&local_3c,(int *)&stack0xffffffffffffffbc);
        }
        in_stack_ffffffffffffffb0 =
             __gnu_cxx::
             __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
             ::operator+(in_stack_ffffffffffffff78._M_current,(difference_type)in_RDI);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                                   *)in_RDI,
                                  (__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
              bVar3) {
          ppCVar4 = __gnu_cxx::
                    __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                    ::operator*((__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                                 *)&stack0xffffffffffffffb0);
          in_stack_ffffffffffffffa8 = (Internal *)*ppCVar4;
          bVar3 = get_ternary_clause((Internal *)
                                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                     (Clause *)in_stack_ffffffffffffffb0._M_current,
                                     (int *)in_stack_ffffffffffffffa8,
                                     (int *)CONCAT44(in_stack_ffffffffffffffa4,
                                                     in_stack_ffffffffffffffa0),
                                     (int *)CONCAT44(in_stack_ffffffffffffff9c,
                                                     in_stack_ffffffffffffff98));
          if (bVar3) {
            if (in_stack_ffffffffffffffa0 == local_14) {
              std::swap<int>((int *)&stack0xffffffffffffffa4,(int *)&stack0xffffffffffffffa0);
            }
            if (in_stack_ffffffffffffff9c == local_14) {
              std::swap<int>((int *)&stack0xffffffffffffffa4,(int *)&stack0xffffffffffffff9c);
            }
            iVar1 = local_40;
            if (local_40 < 1) {
              iVar1 = -local_40;
            }
            iVar7 = in_stack_ffffffffffffff9c;
            if (in_stack_ffffffffffffff9c < 1) {
              iVar7 = -in_stack_ffffffffffffff9c;
            }
            if (iVar1 == iVar7) {
              std::swap<int>((int *)&stack0xffffffffffffffa0,(int *)&stack0xffffffffffffff9c);
            }
            iVar1 = in_stack_ffffffffffffffbc;
            if (in_stack_ffffffffffffffbc < 1) {
              iVar1 = -in_stack_ffffffffffffffbc;
            }
            iVar7 = in_stack_ffffffffffffff9c;
            if (in_stack_ffffffffffffff9c < 1) {
              iVar7 = -in_stack_ffffffffffffff9c;
            }
            if (((iVar1 != iVar7) && (local_40 == -in_stack_ffffffffffffffa0)) &&
               ((pCVar5 = find_ternary_clause(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                                              in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c),
                pCVar5 != (Clause *)0x0 &&
                (pCVar6 = find_ternary_clause(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                                              in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c),
                pCVar6 != (Clause *)0x0)))) {
              *(uint *)&local_38->field_0x8 = *(uint *)&local_38->field_0x8 & 0xffffffdf | 0x20;
              uVar8._0_1_ = in_stack_ffffffffffffffa8->preprocessing;
              uVar8._1_1_ = in_stack_ffffffffffffffa8->protected_reasons;
              uVar8._2_1_ = in_stack_ffffffffffffffa8->force_saved_phase;
              uVar8._3_1_ = in_stack_ffffffffffffffa8->searching_lucky_phases;
              uVar8 = uVar8 & 0xffffffdf | 0x20;
              in_stack_ffffffffffffffa8->preprocessing = (bool)(char)uVar8;
              in_stack_ffffffffffffffa8->protected_reasons = (bool)(char)(uVar8 >> 8);
              in_stack_ffffffffffffffa8->force_saved_phase = (bool)(char)(uVar8 >> 0x10);
              in_stack_ffffffffffffffa8->searching_lucky_phases = (bool)(char)(uVar8 >> 0x18);
              *(uint *)&pCVar5->field_0x8 = *(uint *)&pCVar5->field_0x8 & 0xffffffdf | 0x20;
              *(uint *)&pCVar6->field_0x8 = *(uint *)&pCVar6->field_0x8 & 0xffffffdf | 0x20;
              std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                        ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                         in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78._M_current);
              std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                        ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                         in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78._M_current);
              std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                        ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                         in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78._M_current);
              std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                        ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                         in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78._M_current);
              (in_RDI->stats).elimgates = (in_RDI->stats).elimgates + 1;
              (in_RDI->stats).elimites = (in_RDI->stats).elimites + 1;
              return;
            }
          }
          in_stack_ffffffffffffff80 =
               __gnu_cxx::
               __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
               ::operator++(in_stack_ffffffffffffff78._M_current,(int)((ulong)in_RDI >> 0x20));
        }
      }
      in_stack_ffffffffffffff78 =
           __gnu_cxx::
           __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
           ::operator++(in_stack_ffffffffffffff78._M_current,(int)((ulong)in_RDI >> 0x20));
    }
  }
  return;
}

Assistant:

void Internal::find_if_then_else (Eliminator &eliminator, int pivot) {

  if (!opts.elimites)
    return;

  assert (opts.elimsubst);

  if (unsat)
    return;
  if (val (pivot))
    return;
  if (!eliminator.gates.empty ())
    return;

  const Occs &os = occs (pivot);
  const auto end = os.end ();
  for (auto i = os.begin (); i != end; i++) {
    Clause *di = *i;
    int ai, bi, ci;
    if (!get_ternary_clause (di, ai, bi, ci))
      continue;
    if (bi == pivot)
      swap (ai, bi);
    if (ci == pivot)
      swap (ai, ci);
    assert (ai == pivot);
    for (auto j = i + 1; j != end; j++) {
      Clause *dj = *j;
      int aj, bj, cj;
      if (!get_ternary_clause (dj, aj, bj, cj))
        continue;
      if (bj == pivot)
        swap (aj, bj);
      if (cj == pivot)
        swap (aj, cj);
      assert (aj == pivot);
      if (abs (bi) == abs (cj))
        swap (bj, cj);
      if (abs (ci) == abs (cj))
        continue;
      if (bi != -bj)
        continue;
      Clause *d1 = find_ternary_clause (-pivot, bi, -ci);
      if (!d1)
        continue;
      Clause *d2 = find_ternary_clause (-pivot, bj, -cj);
      if (!d2)
        continue;
      LOG (di, "1st if-then-else");
      LOG (dj, "2nd if-then-else");
      LOG (d1, "3rd if-then-else");
      LOG (d2, "4th if-then-else");
      LOG ("found ITE gate %d == (%d ? %d : %d)", pivot, -bi, -ci, -cj);
      assert (!di->gate);
      assert (!dj->gate);
      assert (!d1->gate);
      assert (!d2->gate);
      di->gate = true;
      dj->gate = true;
      d1->gate = true;
      d2->gate = true;
      eliminator.gates.push_back (di);
      eliminator.gates.push_back (dj);
      eliminator.gates.push_back (d1);
      eliminator.gates.push_back (d2);
      stats.elimgates++;
      stats.elimites++;
      return;
    }
  }
}